

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

pointer __thiscall
google::protobuf::RepeatedField<double>::AddNAlreadyReserved(RepeatedField<double> *this,int n)

{
  ulong uVar1;
  int iVar2;
  string *psVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  int v;
  LogMessage aLStack_38 [16];
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  iVar2 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  if ((uVar1 & 4) == 0) {
    v = 1;
  }
  else {
    v = (this->soo_rep_).field_0.long_rep.capacity;
  }
  psVar3 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_
                     (v - iVar2,n,"capacity - old_size >= n");
  if (psVar3 == (string *)0x0) {
    if ((uVar1 & 4) == 0) {
      pcVar4 = (char *)((long)&(this->soo_rep_).field_0 + 8);
    }
    else {
      pcVar4 = internal::LongSooRep::elements((LongSooRep *)this);
    }
    iVar2 = ExchangeCurrentSize(this,(uVar1 & 4) == 0,iVar2 + n);
    return (pointer)(pcVar4 + (long)iVar2 * 8);
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)aLStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
             ,0x306,psVar3->_M_string_length,(psVar3->_M_dataplus)._M_p);
  pLVar5 = absl::lts_20240722::log_internal::LogMessage::operator<<(aLStack_38,v);
  pLVar5 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar5,(char (*) [3])0x30a546);
  absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar5,iVar2);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)aLStack_38)
  ;
}

Assistant:

inline Element* RepeatedField<Element>::AddNAlreadyReserved(int n)
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_ATTRIBUTE_UNUSED const int capacity = Capacity(is_soo);
  ABSL_DCHECK_GE(capacity - old_size, n) << capacity << ", " << old_size;
  Element* p =
      unsafe_elements(is_soo) + ExchangeCurrentSize(is_soo, old_size + n);
  for (Element *begin = p, *end = p + n; begin != end; ++begin) {
    new (static_cast<void*>(begin)) Element;
  }
  return p;
}